

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fstream.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  char cVar6;
  string tmp;
  ostringstream ss_1;
  ofstream fo;
  ostringstream ss;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  undefined1 local_5e8;
  undefined7 uStack_5e7;
  string local_5d8 [32];
  string local_5b8 [376];
  long local_440;
  filebuf local_438 [24];
  byte abStack_420 [216];
  ios_base local_348 [264];
  long local_240 [2];
  ostream local_230 [8];
  long local_228;
  byte abStack_220 [496];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing fstream",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::ofstream::ofstream(&local_440);
  std::ofstream::open((char *)&local_440,0x105004);
  if ((abStack_420[*(long *)(local_440 + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error fo in ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
               ,0x65);
    local_5b8[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_240,(char *)local_5b8,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_5b8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,"test",4);
  std::ios::widen((char)(ostream *)&local_440 + (char)*(undefined8 *)(local_440 + -0x18));
  std::ostream::put((char)&local_440);
  std::ostream::flush();
  std::ofstream::close();
  std::ifstream::ifstream(local_240);
  std::ifstream::open((char *)local_240,0x105004);
  if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"Error fi in ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
               ,0x65);
    local_5f8 = (undefined1 *)CONCAT71(local_5f8._1_7_,0x3a);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5b8,(char *)&local_5f8,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_5f8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_5f0 = 0;
  local_5e8 = 0;
  local_5f8 = &local_5e8;
  std::operator>>((istream *)local_240,(string *)&local_5f8);
  iVar1 = std::__cxx11::string::compare((char *)&local_5f8);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,"Error tmp==\"test\" in ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
               ,0x65);
    local_5d8[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5b8,(char *)local_5d8,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_5d8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::close();
  if (local_5f8 != &local_5e8) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  std::ifstream::~ifstream(local_240);
  std::ifstream::ifstream(local_240,anon_var_dwarf_242c,_S_in);
  if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"Error fi in ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
               ,0x65);
    local_5f8 = (undefined1 *)CONCAT71(local_5f8._1_7_,0x3a);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5b8,(char *)&local_5f8,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_5f8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_5f0 = 0;
  local_5e8 = 0;
  local_5f8 = &local_5e8;
  std::operator>>((istream *)local_240,(string *)&local_5f8);
  iVar1 = std::__cxx11::string::compare((char *)&local_5f8);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,"Error tmp==\"test\" in ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
               ,0x65);
    local_5d8[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5b8,(char *)local_5d8,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_5d8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::close();
  if (local_5f8 != &local_5e8) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  std::ifstream::~ifstream(local_240);
  std::ifstream::ifstream(local_240,anon_var_dwarf_242c,_S_bin);
  if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"Error fi in ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
               ,0x65);
    local_5f8 = (undefined1 *)CONCAT71(local_5f8._1_7_,0x3a);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5b8,(char *)&local_5f8,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_5f8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_5f0 = 0;
  local_5e8 = 0;
  local_5f8 = &local_5e8;
  std::operator>>((istream *)local_240,(string *)&local_5f8);
  iVar1 = std::__cxx11::string::compare((char *)&local_5f8);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,"Error tmp==\"test\" in ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
               ,0x65);
    local_5d8[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5b8,(char *)local_5d8,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x43);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_5d8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::close();
  if (local_5f8 != &local_5e8) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  std::ifstream::~ifstream(local_240);
  std::ifstream::ifstream(local_240);
  remove(anon_var_dwarf_242c);
  std::ifstream::open((char *)local_240,0x105004);
  if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"Error !fi in ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
               ,0x65);
    local_5f8 = (undefined1 *)CONCAT71(local_5f8._1_7_,0x3a);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5b8,(char *)&local_5f8,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_5f8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::~ifstream(local_240);
  std::fstream::fstream(local_240,anon_var_dwarf_242c,_S_trunc|_S_out|_S_in|_S_bin);
  if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"Error f in ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
               ,0x65);
    local_5f8 = (undefined1 *)CONCAT71(local_5f8._1_7_,0x3a);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5b8,(char *)&local_5f8,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_5f8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_230,"test2",5);
  local_5f0 = 0;
  local_5e8 = 0;
  local_5f8 = &local_5e8;
  std::istream::seekg(local_240,0,0);
  std::operator>>((istream *)local_240,(string *)&local_5f8);
  iVar1 = std::__cxx11::string::compare((char *)&local_5f8);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,"Error tmp==\"test2\" in ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
               ,0x65);
    local_5d8[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5b8,(char *)local_5d8,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_5d8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::fstream::close();
  if (local_5f8 != &local_5e8) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  std::fstream::~fstream(local_240);
  remove(anon_var_dwarf_242c);
  local_440 = _VTT;
  *(undefined8 *)(local_438 + *(long *)(_VTT + -0x18) + -8) = _open;
  std::filebuf::~filebuf(local_438);
  std::ios_base::~ios_base(local_348);
  iVar1 = -1;
  while( true ) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Complex io with buffer = ",0x19);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::fstream::fstream(local_240);
    if (iVar1 == 0) {
      (**(code **)(local_228 + 0x18))(&local_228,0,0);
    }
    else if (0 < iVar1) {
      (**(code **)(local_228 + 0x18))(&local_228,&local_5f8,iVar1);
    }
    std::fstream::open((char *)local_240,0x105004);
    cVar6 = (char)local_230;
    std::ostream::put(cVar6);
    std::ostream::put(cVar6);
    std::ostream::put(cVar6);
    std::ostream::put(cVar6);
    std::ostream::put(cVar6);
    std::ostream::put(cVar6);
    std::ostream::put(cVar6);
    std::istream::seekg(local_240,0,0);
    iVar2 = std::istream::get();
    if (iVar2 != 0x61) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'a\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::seekg((long)local_240,_S_cur);
    iVar2 = std::istream::get();
    if (iVar2 != 99) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'c\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::seekg((long)local_240,~_S_beg);
    iVar2 = std::istream::get();
    if (iVar2 != 99) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'c\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar3 = (long *)std::istream::seekg(local_240,1,0);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.seekg(1) in ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x71);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ostream::put(cVar6);
    iVar2 = std::istream::get();
    if (iVar2 != 99) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'c\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x73);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar3 = (long *)std::istream::seekg(local_240,1,0);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.seekg(1) in ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x74);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = std::istream::get();
    if (iVar2 != 0x42) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get() == \'B\' in ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x75);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::seekg(local_240,2,0);
    std::ostream::put(cVar6);
    iVar2 = std::istream::get();
    if (iVar2 != 100) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'d\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x78);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::seekg(local_240,0,0);
    iVar2 = std::istream::get();
    if (iVar2 != 0x61) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'a\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = std::istream::get();
    if (iVar2 != 0x42) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'B\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = std::istream::get();
    if (iVar2 != 0x43) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'C\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = std::istream::get();
    if (iVar2 != 100) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'d\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = std::istream::get();
    if (iVar2 != 0x65) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'e\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar6 = (char)local_240;
    plVar3 = (long *)std::istream::putback(cVar6);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.putback(\'e\') in ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar3 = (long *)std::istream::putback(cVar6);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
    iVar2 = std::istream::get();
    if (iVar2 != 100) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'d\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x81);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = std::istream::get();
    if (iVar2 != 0x65) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'e\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x82);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = std::istream::get();
    if (iVar2 != 0x66) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'f\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x83);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = std::istream::get();
    if (iVar2 != 0x67) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'g\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x84);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = std::istream::get();
    if (iVar2 != -1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==EOF in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x85);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ios::clear((int)*(undefined8 *)(local_240[0] + -0x18) + (int)local_240);
    std::istream::seekg(local_240,1,0);
    iVar2 = std::istream::get();
    if (iVar2 != 0x42) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.get()==\'B\' in ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar3 = (long *)std::istream::putback(cVar6);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.putback(\'B\') in ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x89);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar3 = (long *)std::istream::putback(cVar6);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error f.putback(\'a\') in ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar3 = (long *)std::istream::putback(cVar6);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error !f.putback(\'x\') in ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fstream::close();
    iVar2 = remove(anon_var_dwarf_242c);
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Error nowide::remove(example)==0 in ",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                 ,0x65);
      local_5b8[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_440,(char *)local_5b8,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_5b8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fstream::~fstream(local_240);
    iVar1 = iVar1 + 1;
    if (iVar1 == 0x10) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      return 0;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_440,"Error f.putback(\'d\') in ",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_440,
             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
             ,0x65);
  local_5b8[0] = (string)0x3a;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_440,(char *)local_5b8,1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,local_5b8);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    
    char const *example = "\xd7\xa9-\xd0\xbc-\xce\xbd" ".txt";
#ifdef NOWIDE_WINDOWS
    wchar_t const *wexample = L"\u05e9-\u043c-\u03bd.txt";
#endif    

    try {
        namespace nw=nowide;
        
        std::cout << "Testing fstream" << std::endl;
        {
            nw::ofstream fo;
            fo.open(example);
            TEST(fo);
            fo<<"test"<<std::endl;
            fo.close();
            #ifdef NOWIDE_WINDOWS
            {
                FILE *tmp=_wfopen(wexample,L"r");
                TEST(tmp);
                TEST(fgetc(tmp)=='t');
                TEST(fgetc(tmp)=='e');
                TEST(fgetc(tmp)=='s');
                TEST(fgetc(tmp)=='t');
                TEST(fgetc(tmp)=='\n');
                TEST(fgetc(tmp)==EOF);
                fclose(tmp);
            }
            #endif
            {
                nw::ifstream fi;
                fi.open(example);
                TEST(fi);
                std::string tmp;
                fi  >> tmp;
                TEST(tmp=="test");
                fi.close();
            }
            {
                nw::ifstream fi(example);
                TEST(fi);
                std::string tmp;
                fi  >> tmp;
                TEST(tmp=="test");
                fi.close();
            }
            {
                nw::ifstream fi(example,std::ios::binary);
                TEST(fi);
                std::string tmp;
                fi  >> tmp;
                TEST(tmp=="test");
                fi.close();
            }

            {
                nw::ifstream fi;
                nw::remove(example);
                fi.open(example);
                TEST(!fi);
            }
            {
                nw::fstream f(example,nw::fstream::in | nw::fstream::out | nw::fstream::trunc | nw::fstream::binary);
                TEST(f);
                f << "test2" ;
                std::string tmp;
                f.seekg(0);
                f>> tmp;
                TEST(tmp=="test2");
                f.close();
            }
            nw::remove(example);
        }
        
        for(int i=-1;i<16;i++) {
            std::cout << "Complex io with buffer = " << i << std::endl;
            char buf[16];
            nw::fstream f;
            if(i==0)
                f.rdbuf()->pubsetbuf(0,0);
            else if (i > 0) 
                f.rdbuf()->pubsetbuf(buf,i);
            
            f.open(example,nw::fstream::in | nw::fstream::out | nw::fstream::trunc | nw::fstream::binary);
            f.put('a');
            f.put('b');
            f.put('c');
            f.put('d');
            f.put('e');
            f.put('f');
            f.put('g');
            f.seekg(0);
            TEST(f.get()=='a');
            f.seekg(1,std::ios::cur);
            TEST(f.get()=='c');
            f.seekg(-1,std::ios::cur);
            TEST(f.get()=='c');
            TEST(f.seekg(1));
            f.put('B');
            TEST(f.get()=='c');
            TEST(f.seekg(1));
            TEST(f.get() == 'B');
            f.seekg(2);
            f.put('C');
            TEST(f.get()=='d');
            f.seekg(0);
            TEST(f.get()=='a');
            TEST(f.get()=='B');
            TEST(f.get()=='C');
            TEST(f.get()=='d');
            TEST(f.get()=='e');
            TEST(f.putback('e'));
            TEST(f.putback('d'));
            TEST(f.get()=='d');
            TEST(f.get()=='e');
            TEST(f.get()=='f');
            TEST(f.get()=='g');
            TEST(f.get()==EOF);
            f.clear();
            f.seekg(1);
            TEST(f.get()=='B');
            TEST(f.putback('B'));
            TEST(f.putback('a'));
            TEST(!f.putback('x'));
            f.close();
            TEST(nowide::remove(example)==0);
            
        }
            
    }
    catch(std::exception const &e) {
        std::cerr << e.what() << std::endl;
        return 1;
    }
    std::cout << "Ok" << std::endl;
    return 0;

}